

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# durand_kerner_method.cc
# Opt level: O2

bool __thiscall
sptk::DurandKernerMethod::Run
          (DurandKernerMethod *this,vector<double,_std::allocator<double>_> *coefficients,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *roots,
          bool *is_converged)

{
  double *pdVar1;
  uint uVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  ulong uVar6;
  double *pdVar7;
  complex<double> *__y;
  size_type __new_size;
  ulong uVar8;
  pointer pcVar9;
  int m;
  int l;
  long lVar10;
  long lVar11;
  double dVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar13;
  double dVar14;
  bool halt;
  pointer local_90;
  double local_88;
  double dStack_80;
  bool *local_70;
  complex<double> delta;
  double local_58;
  double dStack_50;
  ulong local_40;
  double local_38;
  
  if (this->is_valid_ == true) {
    if (is_converged != (bool *)0x0) {
      bVar5 = false;
      if (roots != (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x0) {
        pdVar7 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        __new_size = (long)(coefficients->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
        bVar5 = false;
        if (__new_size == (long)this->num_order_) {
          local_90 = (roots->
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          local_70 = is_converged;
          if ((long)(roots->
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)local_90 >> 4 != __new_size)
          {
            std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                      (roots,__new_size);
            pdVar7 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_90 = (roots->
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
          }
          *local_70 = false;
          lVar10 = 1;
          dVar14 = 0.0;
          while( true ) {
            dVar13 = dVar14;
            uVar2 = this->num_order_;
            uVar6 = (ulong)(int)uVar2;
            if ((long)uVar6 <= lVar10) break;
            pdVar1 = pdVar7 + lVar10;
            lVar10 = lVar10 + 1;
            dVar12 = pow(ABS(*pdVar1),1.0 / (double)(int)lVar10);
            dVar14 = dVar12 + dVar12;
            if (dVar12 + dVar12 <= dVar13) {
              dVar14 = dVar13;
            }
          }
          dVar14 = (double)(int)uVar2;
          dVar12 = -*pdVar7 / dVar14;
          pdVar3 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pdVar4 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar10 = 0;
          uVar8 = 0;
          if (0 < (int)uVar2) {
            uVar8 = (ulong)uVar2;
          }
          for (; uVar8 * 8 != lVar10; lVar10 = lVar10 + 8) {
            *(double *)(local_90->_M_value + lVar10 * 2) =
                 *(double *)((long)pdVar3 + lVar10) * dVar13 + dVar12;
            dVar14 = *(double *)((long)pdVar4 + lVar10) * dVar13 + dVar12;
            *(double *)(local_90->_M_value + lVar10 * 2 + 8) = dVar14;
          }
          local_40 = 0;
          do {
            if (this->num_iteration_ <= (int)local_40) goto LAB_00105334;
            bVar5 = true;
            for (lVar10 = 0; lVar10 < (int)uVar6; lVar10 = lVar10 + 1) {
              local_58 = 1.0;
              dStack_50 = 0.0;
              local_88 = 1.0;
              dStack_80 = 0.0;
              __y = local_90 + lVar10;
              pcVar9 = local_90;
              for (lVar11 = 0; lVar11 < (int)uVar6; lVar11 = lVar11 + 1) {
                std::operator*((complex<double> *)&local_58,__y);
                local_58 = pdVar7[lVar11] + extraout_XMM0_Qa;
                dStack_50 = dVar14 + 0.0;
                dVar14 = local_58;
                if (lVar10 != lVar11) {
                  dVar14 = *(double *)pcVar9->_M_value;
                  delta._M_value._0_8_ = *(double *)__y->_M_value - dVar14;
                  delta._M_value._8_8_ =
                       *(double *)(__y->_M_value + 8) - *(double *)(pcVar9->_M_value + 8);
                  std::operator*((complex<double> *)&local_88,&delta);
                  local_88 = extraout_XMM0_Qa_00;
                  dStack_80 = dVar14;
                }
                uVar6 = (ulong)(uint)this->num_order_;
                pcVar9 = pcVar9 + 1;
              }
              dVar14 = 0.0;
              if ((((local_88 != 0.0) || (NAN(local_88))) || (dStack_80 != 0.0)) || (NAN(dStack_80))
                 ) {
                std::operator/((complex<double> *)&local_58,(complex<double> *)&local_88);
                dVar13 = *(double *)(__y->_M_value + 8);
                *(double *)__y->_M_value = *(double *)__y->_M_value - extraout_XMM0_Qa_01;
                *(double *)(__y->_M_value + 8) = dVar13 - dVar14;
                delta._M_value._0_8_ = extraout_XMM0_Qa_01;
                delta._M_value._8_8_ = dVar14;
                if (bVar5) {
                  local_38 = this->convergence_threshold_;
                  dVar13 = std::abs<double>(&delta);
                  if (local_38 < dVar13) {
                    bVar5 = false;
                  }
                }
              }
              else {
                *(undefined8 *)__y->_M_value = 0;
                *(undefined8 *)(__y->_M_value + 8) = 0;
              }
              uVar6 = (ulong)(uint)this->num_order_;
            }
            local_40 = (ulong)((int)local_40 + 1);
          } while (!bVar5);
          *local_70 = true;
LAB_00105334:
          bVar5 = true;
        }
      }
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool DurandKernerMethod::Run(const std::vector<double>& coefficients,
                             std::vector<std::complex<double> >* roots,
                             bool* is_converged) const {
  // Check inputs.
  if (!is_valid_ ||
      coefficients.size() != static_cast<std::size_t>(num_order_) ||
      NULL == roots || NULL == is_converged) {
    return false;
  }

  // Prepare memories.
  if (roots->size() != static_cast<std::size_t>(num_order_)) {
    roots->resize(num_order_);
  }

  const double* a(&(coefficients[0]));
  std::complex<double>* x(&((*roots)[0]));

  *is_converged = false;

  // Set initial roots using the Aberth's approach.
  {
    double radius(0.0);
    for (int m(1); m < num_order_; ++m) {
      const double r(2.0 * std::pow(std::fabs(a[m]), 1.0 / (m + 1)));
      if (radius < r) {
        radius = r;
      }
    }

    const double center(-a[0] / num_order_);
    for (int m(0); m < num_order_; ++m) {
      x[m].real(center + radius * cosine_table_[m]);
      x[m].imag(center + radius * sine_table_[m]);
    }
  }

  // Find roots using the Durand-Kerner method.
  for (int n(0); n < num_iteration_; ++n) {
    bool halt(true);

    for (int m(0); m < num_order_; ++m) {
      std::complex<double> numerator(1.0);
      std::complex<double> denominator(1.0);
      for (int l(0); l < num_order_; ++l) {
        numerator = numerator * x[m] + std::complex<double>(a[l]);
        if (m != l) denominator = denominator * (x[m] - x[l]);
      }
      if (0.0 == denominator.real() && 0.0 == denominator.imag()) {
        x[m] = 0.0;
      } else {
        const std::complex<double> delta(numerator / denominator);
        x[m] -= delta;
        if (halt && convergence_threshold_ < std::abs(delta)) {
          halt = false;
        }
      }
    }

    if (halt) {
      *is_converged = true;
      break;
    }
  }

  return true;
}